

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_connect_nonblocking(connectdata *conn,int sockindex,_Bool *done)

{
  undefined1 *puVar1;
  _Bool _Var2;
  CURLcode CVar3;
  
  if (((conn->bits).proxy_ssl_connected[sockindex] != true) ||
     (CVar3 = ssl_connect_init_proxy(conn,sockindex), CVar3 == CURLE_OK)) {
    _Var2 = ssl_prefs_check(conn->data);
    if (_Var2) {
      puVar1 = &conn->ssl[sockindex].field_0x10;
      *puVar1 = *puVar1 | 1;
      CVar3 = (*Curl_ssl->connect_nonblocking)(conn,sockindex,done);
      if ((CVar3 == CURLE_OK) && (CVar3 = CURLE_OK, *done == true)) {
        Curl_pgrsTime(conn->data,TIMER_APPCONNECT);
      }
    }
    else {
      CVar3 = CURLE_SSL_CONNECT_ERROR;
    }
  }
  return CVar3;
}

Assistant:

CURLcode
Curl_ssl_connect_nonblocking(struct connectdata *conn, int sockindex,
                             bool *done)
{
  CURLcode result;
  if(conn->bits.proxy_ssl_connected[sockindex]) {
    result = ssl_connect_init_proxy(conn, sockindex);
    if(result)
      return result;
  }

  if(!ssl_prefs_check(conn->data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl requested from here on. */
  conn->ssl[sockindex].use = TRUE;
  result = Curl_ssl->connect_nonblocking(conn, sockindex, done);
  if(!result && *done)
    Curl_pgrsTime(conn->data, TIMER_APPCONNECT); /* SSL is connected */
  return result;
}